

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChAssembly.cpp
# Opt level: O1

void __thiscall chrono::ChAssembly::AddShaft(ChAssembly *this,shared_ptr<chrono::ChShaft> *shaft)

{
  element_type *peVar1;
  __normal_iterator<std::shared_ptr<chrono::ChShaft>_*,_std::vector<std::shared_ptr<chrono::ChShaft>,_std::allocator<std::shared_ptr<chrono::ChShaft>_>_>_>
  _Var2;
  
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<chrono::ChShaft>*,std::vector<std::shared_ptr<chrono::ChShaft>,std::allocator<std::shared_ptr<chrono::ChShaft>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<chrono::ChShaft>const>>
                    ((this->shaftlist).
                     super__Vector_base<std::shared_ptr<chrono::ChShaft>,_std::allocator<std::shared_ptr<chrono::ChShaft>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->shaftlist).
                     super__Vector_base<std::shared_ptr<chrono::ChShaft>,_std::allocator<std::shared_ptr<chrono::ChShaft>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,shaft);
  if (_Var2._M_current !=
      (this->shaftlist).
      super__Vector_base<std::shared_ptr<chrono::ChShaft>,_std::allocator<std::shared_ptr<chrono::ChShaft>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("std::find(std::begin(shaftlist), std::end(shaftlist), shaft) == shaftlist.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChAssembly.cpp"
                  ,0xab,"void chrono::ChAssembly::AddShaft(std::shared_ptr<ChShaft>)");
  }
  peVar1 = (shaft->super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((peVar1->super_ChPhysicsItem).system == (ChSystem *)0x0) {
    (*(peVar1->super_ChPhysicsItem).super_ChObj._vptr_ChObj[6])
              (peVar1,(this->super_ChPhysicsItem).system);
    std::
    vector<std::shared_ptr<chrono::ChShaft>,_std::allocator<std::shared_ptr<chrono::ChShaft>_>_>::
    push_back(&this->shaftlist,shaft);
    ((this->super_ChPhysicsItem).system)->is_updated = false;
    return;
  }
  __assert_fail("shaft->GetSystem() == nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChAssembly.cpp"
                ,0xac,"void chrono::ChAssembly::AddShaft(std::shared_ptr<ChShaft>)");
}

Assistant:

void ChAssembly::AddShaft(std::shared_ptr<ChShaft> shaft) {
    assert(std::find(std::begin(shaftlist), std::end(shaftlist), shaft) == shaftlist.end());
    assert(shaft->GetSystem() == nullptr);  // should remove from other system before adding here

    shaft->SetSystem(system);
    shaftlist.push_back(shaft);

    ////system->is_initialized = false;  // Not needed, unless/until ChShaft::SetupInitial does something
    system->is_updated = false;
}